

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_panner_config ma_panner_config_init(ma_format format,ma_uint32 channels)

{
  ma_panner_config mVar1;
  
  mVar1.channels = channels;
  mVar1.format = format;
  mVar1.mode = ma_pan_mode_balance;
  mVar1.pan = 0.0;
  return mVar1;
}

Assistant:

MA_API ma_panner_config ma_panner_config_init(ma_format format, ma_uint32 channels)
{
    ma_panner_config config;

    MA_ZERO_OBJECT(&config);
    config.format   = format;
    config.channels = channels;
    config.mode     = ma_pan_mode_balance;  /* Set to balancing mode by default because it's consistent with other audio engines and most likely what the caller is expecting. */
    config.pan      = 0;

    return config;
}